

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>::destroy
          (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this)

{
  _Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
  pVar1;
  
  this_00 = (_Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
             *)(this->adapter).childSet;
  pVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
          ::equal_range(this_00,&(this->adapter).pid);
  std::
  _Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
  ::_M_erase_aux(this_00,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<int>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }